

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3SegReaderNext(Fts3Table *p,Fts3SegReader *pReader,int bIncr)

{
  long lVar1;
  Fts3HashElem *pFVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  int *in_R8;
  long lVar10;
  size_t __n;
  char *pcVar11;
  int nPrefix;
  int nSuffix;
  int local_4c;
  u64 local_48;
  uint local_3c;
  char *local_38;
  
  if (pReader->aDoclist == (char *)0x0) {
    pcVar11 = pReader->aNode;
  }
  else {
    pcVar11 = pReader->aDoclist + pReader->nDoclist;
  }
  if ((pcVar11 == (char *)0x0) || (pReader->aNode + pReader->nNode <= pcVar11)) {
    if (pReader->ppNextElem != (Fts3HashElem **)0x0) {
      pFVar2 = *pReader->ppNextElem;
      sqlite3_free(pReader->aNode);
      pReader->aNode = (char *)0x0;
      if (pFVar2 == (Fts3HashElem *)0x0) {
        return 0;
      }
      piVar3 = (int *)pFVar2->data;
      __n = (long)*piVar3 + 1;
      pReader->zTerm = (char *)pFVar2->pKey;
      pReader->nTerm = pFVar2->nKey;
      iVar4 = (int)__n;
      pcVar11 = (char *)sqlite3_malloc(iVar4);
      if (pcVar11 != (char *)0x0) {
        memcpy(pcVar11,*(void **)(piVar3 + 2),__n);
        pReader->nDoclist = iVar4;
        pReader->nNode = iVar4;
        pReader->aDoclist = pcVar11;
        pReader->aNode = pcVar11;
        pReader->ppNextElem = pReader->ppNextElem + 1;
        return 0;
      }
      return 7;
    }
    fts3SegReaderSetEof(pReader);
    if (pReader->iLeafEndBlock <= pReader->iCurrentBlock) {
      return 0;
    }
    lVar10 = pReader->iCurrentBlock + 1;
    pReader->iCurrentBlock = lVar10;
    iVar4 = sqlite3Fts3ReadBlock(p,lVar10,&pReader->aNode,&pReader->nNode,in_R8);
    if (iVar4 != 0) {
      return iVar4;
    }
    pcVar11 = pReader->aNode;
  }
  iVar4 = fts3SegReaderRequire(pReader,pcVar11,0x14);
  if (iVar4 != 0) {
    return iVar4;
  }
  if (*pcVar11 < '\0') {
    uVar6 = sqlite3Fts3GetVarint32(pcVar11,&local_4c);
    uVar7 = (ulong)uVar6;
  }
  else {
    uVar7 = 1;
    local_4c = (int)*pcVar11;
  }
  if (pcVar11[uVar7] < '\0') {
    uVar6 = sqlite3Fts3GetVarint32(pcVar11 + uVar7,(int *)&local_3c);
    uVar8 = (ulong)uVar6;
  }
  else {
    uVar8 = 1;
    local_3c = (int)pcVar11[uVar7];
  }
  uVar6 = local_3c;
  iVar4 = local_4c;
  if (0 < (int)local_3c) {
    pcVar11 = pcVar11 + uVar7 + uVar8;
    uVar7 = (ulong)local_3c;
    if ((long)uVar7 <= (long)(pReader->aNode + ((long)pReader->nNode - (long)pcVar11))) {
      lVar10 = (long)local_4c;
      if (local_4c <= pReader->nTermAlloc) {
        lVar1 = lVar10 + uVar7;
        if (pReader->nTermAlloc < lVar1) {
          local_38 = pReader->zTerm;
          local_48 = lVar1;
          iVar5 = sqlite3_initialize();
          if (iVar5 != 0) {
            return 7;
          }
          local_48 = local_48 * 2;
          pcVar9 = (char *)sqlite3Realloc(local_38,local_48);
          if (pcVar9 == (char *)0x0) {
            return 7;
          }
          pReader->zTerm = pcVar9;
          pReader->nTermAlloc = (int)local_48;
        }
        iVar5 = fts3SegReaderRequire(pReader,pcVar11,uVar6 + 10);
        if (iVar5 != 0) {
          return iVar5;
        }
        memcpy(pReader->zTerm + lVar10,pcVar11,uVar7);
        pReader->nTerm = uVar6 + iVar4;
        iVar4 = (int)pcVar11[uVar7];
        if (pcVar11[uVar7] < '\0') {
          uVar6 = sqlite3Fts3GetVarint32(pcVar11 + uVar7,&pReader->nDoclist);
          uVar8 = (ulong)uVar6;
          iVar4 = pReader->nDoclist;
        }
        else {
          pReader->nDoclist = iVar4;
          uVar8 = 1;
        }
        pcVar11 = pcVar11 + uVar7 + uVar8;
        pReader->aDoclist = pcVar11;
        pReader->pOffsetList = (char *)0x0;
        if ((long)iVar4 <= (long)(pReader->aNode + ((long)pReader->nNode - (long)pcVar11))) {
          if ((pReader->nPopulate == 0) && (pcVar11[(long)iVar4 + -1] != '\0')) {
            return 0x10b;
          }
          return 0;
        }
      }
    }
  }
  return 0x10b;
}

Assistant:

static int fts3SegReaderNext(
  Fts3Table *p, 
  Fts3SegReader *pReader,
  int bIncr
){
  int rc;                         /* Return code of various sub-routines */
  char *pNext;                    /* Cursor variable */
  int nPrefix;                    /* Number of bytes in term prefix */
  int nSuffix;                    /* Number of bytes in term suffix */

  if( !pReader->aDoclist ){
    pNext = pReader->aNode;
  }else{
    pNext = &pReader->aDoclist[pReader->nDoclist];
  }

  if( !pNext || pNext>=&pReader->aNode[pReader->nNode] ){

    if( fts3SegReaderIsPending(pReader) ){
      Fts3HashElem *pElem = *(pReader->ppNextElem);
      sqlite3_free(pReader->aNode);
      pReader->aNode = 0;
      if( pElem ){
        char *aCopy;
        PendingList *pList = (PendingList *)fts3HashData(pElem);
        int nCopy = pList->nData+1;
        pReader->zTerm = (char *)fts3HashKey(pElem);
        pReader->nTerm = fts3HashKeysize(pElem);
        aCopy = (char*)sqlite3_malloc(nCopy);
        if( !aCopy ) return SQLITE_NOMEM;
        memcpy(aCopy, pList->aData, nCopy);
        pReader->nNode = pReader->nDoclist = nCopy;
        pReader->aNode = pReader->aDoclist = aCopy;
        pReader->ppNextElem++;
        assert( pReader->aNode );
      }
      return SQLITE_OK;
    }

    fts3SegReaderSetEof(pReader);

    /* If iCurrentBlock>=iLeafEndBlock, this is an EOF condition. All leaf 
    ** blocks have already been traversed.  */
#ifdef CORRUPT_DB
    assert( pReader->iCurrentBlock<=pReader->iLeafEndBlock || CORRUPT_DB );
#endif
    if( pReader->iCurrentBlock>=pReader->iLeafEndBlock ){
      return SQLITE_OK;
    }

    rc = sqlite3Fts3ReadBlock(
        p, ++pReader->iCurrentBlock, &pReader->aNode, &pReader->nNode, 
        (bIncr ? &pReader->nPopulate : 0)
    );
    if( rc!=SQLITE_OK ) return rc;
    assert( pReader->pBlob==0 );
    if( bIncr && pReader->nPopulate<pReader->nNode ){
      pReader->pBlob = p->pSegments;
      p->pSegments = 0;
    }
    pNext = pReader->aNode;
  }

  assert( !fts3SegReaderIsPending(pReader) );

  rc = fts3SegReaderRequire(pReader, pNext, FTS3_VARINT_MAX*2);
  if( rc!=SQLITE_OK ) return rc;
  
  /* Because of the FTS3_NODE_PADDING bytes of padding, the following is 
  ** safe (no risk of overread) even if the node data is corrupted. */
  pNext += fts3GetVarint32(pNext, &nPrefix);
  pNext += fts3GetVarint32(pNext, &nSuffix);
  if( nSuffix<=0 
   || (&pReader->aNode[pReader->nNode] - pNext)<nSuffix
   || nPrefix>pReader->nTermAlloc
  ){
    return FTS_CORRUPT_VTAB;
  }

  /* Both nPrefix and nSuffix were read by fts3GetVarint32() and so are
  ** between 0 and 0x7FFFFFFF. But the sum of the two may cause integer
  ** overflow - hence the (i64) casts.  */
  if( (i64)nPrefix+nSuffix>(i64)pReader->nTermAlloc ){
    i64 nNew = ((i64)nPrefix+nSuffix)*2;
    char *zNew = sqlite3_realloc64(pReader->zTerm, nNew);
    if( !zNew ){
      return SQLITE_NOMEM;
    }
    pReader->zTerm = zNew;
    pReader->nTermAlloc = nNew;
  }

  rc = fts3SegReaderRequire(pReader, pNext, nSuffix+FTS3_VARINT_MAX);
  if( rc!=SQLITE_OK ) return rc;

  memcpy(&pReader->zTerm[nPrefix], pNext, nSuffix);
  pReader->nTerm = nPrefix+nSuffix;
  pNext += nSuffix;
  pNext += fts3GetVarint32(pNext, &pReader->nDoclist);
  pReader->aDoclist = pNext;
  pReader->pOffsetList = 0;

  /* Check that the doclist does not appear to extend past the end of the
  ** b-tree node. And that the final byte of the doclist is 0x00. If either 
  ** of these statements is untrue, then the data structure is corrupt.
  */
  if( pReader->nDoclist > pReader->nNode-(pReader->aDoclist-pReader->aNode)
   || (pReader->nPopulate==0 && pReader->aDoclist[pReader->nDoclist-1])
  ){
    return FTS_CORRUPT_VTAB;
  }
  return SQLITE_OK;
}